

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUIScrollBar::CGUIScrollBar
          (CGUIScrollBar *this,bool horizontal,IGUIEnvironment *environment,IGUIElement *parent,
          s32 id,rect<int> rectangle,bool noclip)

{
  *(undefined ***)&this->field_0x188 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0x190 = 0;
  *(undefined4 *)&this->field_0x198 = 1;
  IGUIScrollBar::IGUIScrollBar
            ((IGUIScrollBar *)this,&PTR_construction_vtable_24__0028cb18,environment,parent,id,
             rectangle);
  *(undefined8 *)this = 0x28c978;
  *(undefined8 *)&this->field_0x188 = 0x28cb00;
  this->UpButton = (IGUIButton *)0x0;
  this->DownButton = (IGUIButton *)0x0;
  (this->SliderRect).UpperLeftCorner.X = 0;
  (this->SliderRect).UpperLeftCorner.Y = 0;
  (this->SliderRect).LowerRightCorner.X = 0;
  (this->SliderRect).LowerRightCorner.Y = 0;
  this->Dragging = false;
  this->Horizontal = horizontal;
  *(undefined8 *)&this->DraggedBySlider = 0;
  *(undefined8 *)((long)&this->DrawPos + 2) = 0;
  *(undefined2 *)((long)&this->Min + 2) = 0;
  this->Max = 100;
  this->SmallStep = 10;
  this->LargeStep = 0x32;
  this->DesiredPos = 0;
  this->LastChange = 0;
  refreshControls(this);
  this->field_0xa3 = noclip;
  (**(code **)(*(long *)this + 0x18))(this);
  this->field_0x10c = 1;
  IGUIElement::setTabOrder((IGUIElement *)this,-1);
  (**(code **)(*(long *)this + 0x168))(this,0);
  return;
}

Assistant:

CGUIScrollBar::CGUIScrollBar(bool horizontal, IGUIEnvironment *environment,
		IGUIElement *parent, s32 id,
		core::rect<s32> rectangle, bool noclip) :
		IGUIScrollBar(environment, parent, id, rectangle),
		UpButton(0),
		DownButton(0), Dragging(false), Horizontal(horizontal),
		DraggedBySlider(false), TrayClick(false), Pos(0), DrawPos(0),
		DrawHeight(0), Min(0), Max(100), SmallStep(10), LargeStep(50), DesiredPos(0),
		LastChange(0)
{
#ifdef _DEBUG
	setDebugName("CGUIScrollBar");
#endif

	refreshControls();

	setNotClipped(noclip);

	// this element can be tabbed to
	setTabStop(true);
	setTabOrder(-1);

	setPos(0);
}